

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ec_pubkey_serialize
              (secp256k1_context *ctx,uchar *output,size_t *outputlen,secp256k1_pubkey *pubkey,
              uint flags)

{
  ulong __n;
  int iVar1;
  int iVar2;
  size_t sStack_90;
  secp256k1_ge Q;
  
  __n = *outputlen;
  if (__n < (ulong)((flags >> 8 & 1) == 0) * 0x20 + 0x21) {
    (*(ctx->illegal_callback).fn)
              ("*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33 : 65)",
               (ctx->illegal_callback).data);
    iVar2 = 0;
  }
  else {
    *outputlen = 0;
    memset(output,0,__n);
    if ((char)flags == '\x02') {
      iVar1 = secp256k1_pubkey_load(ctx,&Q,pubkey);
      iVar2 = 0;
      if ((iVar1 != 0) && (iVar2 = 0, Q.infinity == 0)) {
        secp256k1_fe_normalize_var(&Q.x);
        secp256k1_fe_normalize_var(&Q.y);
        secp256k1_fe_get_b32(output + 1,&Q.x);
        if ((flags >> 8 & 1) == 0) {
          *output = '\x04';
          secp256k1_fe_get_b32(output + 0x21,&Q.y);
          sStack_90 = 0x41;
        }
        else {
          *output = (byte)Q.y.n[0] & 1 | 2;
          sStack_90 = 0x21;
        }
        *outputlen = sStack_90;
        iVar2 = 1;
      }
    }
    else {
      (*(ctx->illegal_callback).fn)
                ("(flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION",
                 (ctx->illegal_callback).data);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int secp256k1_ec_pubkey_serialize(const secp256k1_context* ctx, unsigned char *output, size_t *outputlen, const secp256k1_pubkey* pubkey, unsigned int flags) {
    secp256k1_ge Q;
    size_t len;
    int ret = 0;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(outputlen != NULL);
    ARG_CHECK(*outputlen >= ((flags & SECP256K1_FLAGS_BIT_COMPRESSION) ? 33 : 65));
    len = *outputlen;
    *outputlen = 0;
    ARG_CHECK(output != NULL);
    memset(output, 0, len);
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK((flags & SECP256K1_FLAGS_TYPE_MASK) == SECP256K1_FLAGS_TYPE_COMPRESSION);
    if (secp256k1_pubkey_load(ctx, &Q, pubkey)) {
        ret = secp256k1_eckey_pubkey_serialize(&Q, output, &len, flags & SECP256K1_FLAGS_BIT_COMPRESSION);
        if (ret) {
            *outputlen = len;
        }
    }
    return ret;
}